

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
::emplace_value<phmap::test_internal::MovableOnlyInstance>
          (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
           *this,size_type i,allocator_type *alloc,MovableOnlyInstance *args)

{
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  bVar1;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *in_RAX;
  ulong uVar2;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *pbVar3;
  uint uVar4;
  ulong i_00;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *local_28;
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  uVar2 = (ulong)(byte)this[10];
  if (i <= uVar2) {
    local_28 = in_RAX;
    if (i < uVar2) {
      local_28 = this + (ulong)(byte)this[10] * 0x10;
      btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
      ::value_init<phmap::test_internal::MovableOnlyInstance*>
                ((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
                  *)this,uVar2,alloc,(MovableOnlyInstance **)&local_28);
      uVar2 = (ulong)(byte)this[10] - 1;
      if (i < uVar2) {
        pbVar3 = this + (ulong)(byte)this[10] * 0x10 + 8;
        do {
          *(undefined8 *)(pbVar3 + -8) = *(undefined8 *)(pbVar3 + -0x18);
          if (*pbVar3 ==
              (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
               )0x1) {
            test_internal::BaseCountedInstance::num_live_instances_ =
                 test_internal::BaseCountedInstance::num_live_instances_ + -1;
          }
          *pbVar3 = pbVar3[-0x10];
          pbVar3[-0x10] =
               (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                )0x0;
          test_internal::BaseCountedInstance::num_moves_ =
               test_internal::BaseCountedInstance::num_moves_ + 1;
          pbVar3 = pbVar3 + -0x10;
          uVar2 = uVar2 - 1;
        } while (i < uVar2);
      }
      value_destroy(this,i,alloc);
    }
    value_init<phmap::test_internal::MovableOnlyInstance>(this,i,alloc,args);
    bVar1 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
             )((char)this[10] + 1);
    this[10] = bVar1;
    if (this[0xb] ==
        (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
         )0x0) {
      uVar2 = i + 1;
      if (uVar2 < (byte)bVar1) {
        i_00 = (ulong)(byte)bVar1;
        if ((uint)uVar2 < (uint)(byte)bVar1) {
          do {
            uVar4 = (int)i_00 - 1;
            pbVar3 = child(this,(ulong)uVar4);
            set_child(this,i_00,pbVar3);
            i_00 = (ulong)uVar4;
          } while ((int)(uint)uVar2 < (int)uVar4);
        }
        mutable_child(this,uVar2);
      }
    }
    return;
  }
  __assert_fail("i <= count()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x852,
                "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>, Args = <phmap::test_internal::MovableOnlyInstance>]"
               );
}

Assistant:

inline void btree_node<P>::emplace_value(const size_type i,
                                             allocator_type *alloc,
                                             Args &&... args) {
        assert(i <= count());
        // Shift old values to create space for new value and then construct it in
        // place.
        if (i < count()) {
            value_init(count(), alloc, slot(count() - 1));
            for (size_type j = count() - 1; j > i; --j)
                params_type::move(alloc, slot(j - 1), slot(j));
            value_destroy(i, alloc);
        }
        value_init(i, alloc, std::forward<Args>(args)...);
        set_count((field_type)(count() + 1));

        if (!leaf() && count() > i + 1) {
            for (int j = count(); j > (int)(i + 1); --j) {
                set_child(j, child(j - 1));
            }
            clear_child(i + 1);
        }
    }